

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<protozero::pbf_reader_const&>
          (AssertionHandler *this,ExprLhs<const_protozero::pbf_reader_&> *expr)

{
  ITransientExpression local_20;
  pbf_reader *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = local_10->m_data != local_10->m_end;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0019c6d8;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }